

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_RGB_Image *rgb,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  uchar *data;
  uint w_00;
  uint h_00;
  int iVar1;
  int iVar2;
  int h;
  int w;
  uchar *di;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_RGB_Image *rgb_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  data = rgb->array;
  w_00 = Fl_Image::w(&rgb->super_Fl_Image);
  h_00 = Fl_Image::h(&rgb->super_Fl_Image);
  this->mask = (uchar *)0x0;
  if (2 < this->lang_level_) {
    iVar1 = Fl_Image::d(&rgb->super_Fl_Image);
    iVar2 = Fl_Image::ld(&rgb->super_Fl_Image);
    iVar1 = alpha_mask(this,data,w_00,h_00,iVar1,iVar2);
    if (iVar1 != 0) {
      return;
    }
  }
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)(uint)WP,(ulong)(uint)HP);
  iVar1 = Fl_Image::d(&rgb->super_Fl_Image);
  iVar2 = Fl_Image::ld(&rgb->super_Fl_Image);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2f])
            (this,data,(ulong)(uint)(XP + cx),(ulong)(uint)(YP + cy),(ulong)w_00,(ulong)h_00,iVar1,
             iVar2);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])();
  if (this->mask != (uchar *)0x0) {
    operator_delete__(this->mask);
  }
  this->mask = (uchar *)0x0;
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_RGB_Image * rgb,int XP, int YP, int WP, int HP, int cx, int cy){
  const uchar  * di = rgb->array;
  int w = rgb->w();
  int h = rgb->h();
  mask=0;
  if (lang_level_>2) //when not true, not making alphamask, mixing colors instead...
  if (alpha_mask(di, w, h, rgb->d(),rgb->ld())) return; //everthing masked, no need for painting!
  push_clip(XP, YP, WP, HP);
  draw_image(di, XP + cx, YP + cy, w, h, rgb->d(), rgb->ld());
  pop_clip();
  delete[]mask;
  mask=0;
}